

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
 __thiscall
spvtools::opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
          (ConvertToSampledImagePass *this,char *str)

{
  int iVar1;
  tuple<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  tVar2;
  pointer this_00;
  value_type local_34;
  uint32_t local_2c [2];
  uint32_t binding;
  uint32_t descriptor_set;
  unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  descriptor_set_binding_pairs;
  char *str_local;
  
  descriptor_set_binding_pairs._M_t.
  super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  .
  super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
        )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
          )str;
  if (str == (char *)0x0) {
    std::
    unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
    ::
    unique_ptr<std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>,void>
              ((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
                *)this,(nullptr_t)0x0);
  }
  else {
    MakeUnique<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>
              ();
    while (iVar1 = isspace((int)*(char *)descriptor_set_binding_pairs._M_t.
                                         super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                                         ._M_head_impl), iVar1 != 0) {
      descriptor_set_binding_pairs._M_t.
      super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      .
      super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )((long)descriptor_set_binding_pairs._M_t.
                    super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                    ._M_head_impl + 1);
    }
    while (*(char *)descriptor_set_binding_pairs._M_t.
                    super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                    ._M_head_impl != '\0') {
      binding = 0;
      tVar2.
      super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      .
      super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
            )anon_unknown_19::ParseNumberUntilSeparator
                       ((char *)descriptor_set_binding_pairs._M_t.
                                super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                                ._M_head_impl,&binding);
      if (tVar2.
          super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
          .
          super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
          ._M_head_impl ==
          (_Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
           )0x0) {
        descriptor_set_binding_pairs._M_t.
        super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
        .
        super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
              )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
                )tVar2.
                 super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                 ._M_head_impl;
        std::
        unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
        ::
        unique_ptr<std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>,void>
                  ((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
                    *)this,(nullptr_t)0x0);
        goto LAB_00964171;
      }
      descriptor_set_binding_pairs._M_t.
      super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      .
      super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )((long)tVar2.
                    super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                    ._M_head_impl + 1);
      if (*(char *)tVar2.
                   super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                   ._M_head_impl != ':') {
        std::
        unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
        ::
        unique_ptr<std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>,void>
                  ((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
                    *)this,(nullptr_t)0x0);
        goto LAB_00964171;
      }
      local_2c[0] = 0;
      descriptor_set_binding_pairs._M_t.
      super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
      .
      super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )anon_unknown_19::ParseNumberUntilSeparator
                       ((char *)descriptor_set_binding_pairs._M_t.
                                super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                                ._M_head_impl,local_2c);
      if ((tuple<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
           )descriptor_set_binding_pairs._M_t.
            super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
            .
            super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
            ._M_head_impl ==
          (_Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
           )0x0) {
        std::
        unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
        ::
        unique_ptr<std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>,void>
                  ((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>,std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
                    *)this,(nullptr_t)0x0);
        goto LAB_00964171;
      }
      this_00 = std::
                unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                ::operator->((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                              *)&stack0xffffffffffffffe0);
      local_34.descriptor_set = binding;
      local_34.binding = local_2c[0];
      std::
      vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
      ::push_back(this_00,&local_34);
      while (iVar1 = isspace((int)*(char *)descriptor_set_binding_pairs._M_t.
                                           super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                                           ._M_head_impl), iVar1 != 0) {
        descriptor_set_binding_pairs._M_t.
        super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
        .
        super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
              )((long)descriptor_set_binding_pairs._M_t.
                      super___uniq_ptr_impl<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
                      ._M_head_impl + 1);
      }
    }
    std::
    unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                  *)this,(unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                          *)&stack0xffffffffffffffe0);
LAB_00964171:
    local_2c[1] = 1;
    std::
    unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                   *)&stack0xffffffffffffffe0);
  }
  return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VectorOfDescriptorSetAndBindingPairs>
ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
    const char* str) {
  if (!str) return nullptr;

  auto descriptor_set_binding_pairs =
      MakeUnique<VectorOfDescriptorSetAndBindingPairs>();

  while (std::isspace(*str)) str++;  // skip leading spaces.

  // The parsing loop, break when points to the end.
  while (*str) {
    // Parse the descriptor set.
    uint32_t descriptor_set = 0;
    str = ParseNumberUntilSeparator(str, &descriptor_set);
    if (str == nullptr) return nullptr;

    // Find the ':', spaces between the descriptor set and the ':' are not
    // allowed.
    if (*str++ != ':') {
      // ':' not found
      return nullptr;
    }

    // Parse the binding.
    uint32_t binding = 0;
    str = ParseNumberUntilSeparator(str, &binding);
    if (str == nullptr) return nullptr;

    descriptor_set_binding_pairs->push_back({descriptor_set, binding});

    // Skip trailing spaces.
    while (std::isspace(*str)) str++;
  }

  return descriptor_set_binding_pairs;
}